

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O1

string * __thiscall
deqp::gles3::Performance::textureLookupFragmentTemplate_abi_cxx11_
          (string *__return_storage_ptr__,Performance *this,int numLookups,
          ConditionalUsage conditionalUsage,ConditionalType conditionalType)

{
  long *plVar1;
  char *pcVar2;
  long *plVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  bool bVar8;
  ostringstream s;
  long *local_248;
  long local_240;
  long local_238;
  long lStack_230;
  long *local_228;
  long local_220;
  long local_218;
  long lStack_210;
  string *local_208;
  long *local_200;
  long local_1f8;
  long local_1f0;
  long lStack_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e0;
  char *local_1d8;
  Performance *local_1d0;
  long *local_1c8 [2];
  long local_1b8 [2];
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  ios_base local_138 [264];
  
  local_1d8 = (char *)CONCAT44(local_1d8._4_4_,conditionalUsage);
  local_1e0 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1e0;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_208 = __return_storage_ptr__;
  local_1d0 = this;
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((int)local_1d8 == 2 && numLookups != 0) {
    std::__cxx11::string::append((char *)local_208);
  }
  if (0 < (int)(uint)local_1d0) {
    iVar6 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::ostream::operator<<((ostringstream *)&local_1a8,iVar6);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_200,0,(char *)0x0,0x1c24c30);
      local_228 = &local_218;
      plVar3 = plVar1 + 2;
      if ((long *)*plVar1 == plVar3) {
        local_218 = *plVar3;
        lStack_210 = plVar1[3];
      }
      else {
        local_218 = *plVar3;
        local_228 = (long *)*plVar1;
      }
      local_220 = plVar1[1];
      *plVar1 = (long)plVar3;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      plVar1 = (long *)std::__cxx11::string::append((char *)&local_228);
      local_248 = &local_238;
      plVar3 = plVar1 + 2;
      if ((long *)*plVar1 == plVar3) {
        local_238 = *plVar3;
        lStack_230 = plVar1[3];
      }
      else {
        local_238 = *plVar3;
        local_248 = (long *)*plVar1;
      }
      local_240 = plVar1[1];
      *plVar1 = (long)plVar3;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_208,(ulong)local_248);
      if (local_248 != &local_238) {
        operator_delete(local_248,local_238 + 1);
      }
      if (local_228 != &local_218) {
        operator_delete(local_228,local_218 + 1);
      }
      if (local_200 != &local_1f0) {
        operator_delete(local_200,local_1f0 + 1);
      }
      iVar6 = iVar6 + 1;
    } while ((uint)local_1d0 != iVar6);
  }
  if (numLookups != 0 && (int)local_1d8 == 1) {
    std::__cxx11::string::append((char *)local_208);
  }
  std::__cxx11::string::append((char *)local_208);
  pcVar2 = (char *)0x0;
  if ((int)local_1d8 == 2) {
    pcVar2 = "v_condition${NAME_SPEC} > 0.0";
  }
  pcVar4 = "u_condition${NAME_SPEC} > 0.0";
  if ((int)local_1d8 != 1) {
    pcVar4 = pcVar2;
  }
  bVar8 = (int)local_1d8 != 0;
  local_1d8 = "1.0 > 0.0";
  if (bVar8) {
    local_1d8 = pcVar4;
  }
  if (numLookups == 1) {
    local_200 = &local_1f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,0x1b32ab9);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_200);
    local_228 = &local_218;
    plVar3 = plVar1 + 2;
    if ((long *)*plVar1 == plVar3) {
      local_218 = *plVar3;
      lStack_210 = plVar1[3];
    }
    else {
      local_218 = *plVar3;
      local_228 = (long *)*plVar1;
    }
    local_220 = plVar1[1];
    *plVar1 = (long)plVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_228);
    local_248 = &local_238;
    plVar3 = plVar1 + 2;
    if ((long *)*plVar1 == plVar3) {
      local_238 = *plVar3;
      lStack_230 = plVar1[3];
    }
    else {
      local_238 = *plVar3;
      local_248 = (long *)*plVar1;
    }
    local_240 = plVar1[1];
    *plVar1 = (long)plVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_248);
    plVar3 = plVar1 + 2;
    if ((long *)*plVar1 == plVar3) {
      local_198 = *plVar3;
      lStack_190 = plVar1[3];
      local_1a8 = &local_198;
    }
    else {
      local_198 = *plVar3;
      local_1a8 = (long *)*plVar1;
    }
    local_1a0 = plVar1[1];
    *plVar1 = (long)plVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_208,(ulong)local_1a8);
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    if (local_248 != &local_238) {
      operator_delete(local_248,local_238 + 1);
    }
    if (local_228 != &local_218) {
      operator_delete(local_228,local_218 + 1);
    }
    if (local_200 != &local_1f0) {
      operator_delete(local_200,local_1f0 + 1);
    }
  }
  if (0 < (int)(uint)local_1d0) {
    iVar5 = (uint)local_1d0 - ((int)((uint)local_1d0 + 1) >> 0x1f);
    iVar6 = (uint)local_1d0 - ((int)((uint)local_1d0 + -1) >> 0x1f);
    uVar7 = 0;
    do {
      if (numLookups == 1) {
        if ((int)uVar7 < iVar5 + 1 >> 1) {
          std::__cxx11::string::append((char *)local_208);
        }
      }
      else if ((uVar7 & 1) == 0 && numLookups == 2) {
        local_200 = &local_1f0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,0x1b32ab9);
        plVar1 = (long *)std::__cxx11::string::append((char *)&local_200);
        local_228 = &local_218;
        plVar3 = plVar1 + 2;
        if ((long *)*plVar1 == plVar3) {
          local_218 = *plVar3;
          lStack_210 = plVar1[3];
        }
        else {
          local_218 = *plVar3;
          local_228 = (long *)*plVar1;
        }
        local_220 = plVar1[1];
        *plVar1 = (long)plVar3;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        plVar1 = (long *)std::__cxx11::string::append((char *)&local_228);
        local_248 = &local_238;
        plVar3 = plVar1 + 2;
        if ((long *)*plVar1 == plVar3) {
          local_238 = *plVar3;
          lStack_230 = plVar1[3];
        }
        else {
          local_238 = *plVar3;
          local_248 = (long *)*plVar1;
        }
        local_240 = plVar1[1];
        *plVar1 = (long)plVar3;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        plVar1 = (long *)std::__cxx11::string::append((char *)&local_248);
        local_1a8 = &local_198;
        plVar3 = plVar1 + 2;
        if ((long *)*plVar1 == plVar3) {
          local_198 = *plVar3;
          lStack_190 = plVar1[3];
        }
        else {
          local_198 = *plVar3;
          local_1a8 = (long *)*plVar1;
        }
        local_1a0 = plVar1[1];
        *plVar1 = (long)plVar3;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_208,(ulong)local_1a8);
        if (local_1a8 != &local_198) {
          operator_delete(local_1a8,local_198 + 1);
        }
        if (local_248 != &local_238) {
          operator_delete(local_248,local_238 + 1);
        }
        if (local_228 != &local_218) {
          operator_delete(local_228,local_218 + 1);
        }
        if (local_200 != &local_1f0) {
          operator_delete(local_200,local_1f0 + 1);
        }
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::ostream::operator<<((ostringstream *)&local_1a8,uVar7);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_200,0,(char *)0x0,0x1c5f0ec);
      local_228 = &local_218;
      plVar3 = plVar1 + 2;
      if ((long *)*plVar1 == plVar3) {
        local_218 = *plVar3;
        lStack_210 = plVar1[3];
      }
      else {
        local_218 = *plVar3;
        local_228 = (long *)*plVar1;
      }
      local_220 = plVar1[1];
      *plVar1 = (long)plVar3;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      plVar1 = (long *)std::__cxx11::string::append((char *)&local_228);
      local_248 = &local_238;
      plVar3 = plVar1 + 2;
      if ((long *)*plVar1 == plVar3) {
        local_238 = *plVar3;
        lStack_230 = plVar1[3];
      }
      else {
        local_238 = *plVar3;
        local_248 = (long *)*plVar1;
      }
      local_240 = plVar1[1];
      *plVar1 = (long)plVar3;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_208,(ulong)local_248);
      if (local_248 != &local_238) {
        operator_delete(local_248,local_238 + 1);
      }
      if (local_228 != &local_218) {
        operator_delete(local_228,local_218 + 1);
      }
      if (local_200 != &local_1f0) {
        operator_delete(local_200,local_1f0 + 1);
      }
      if ((numLookups == 1) && (iVar6 + -1 >> 1 == uVar7)) {
        std::__cxx11::string::append((char *)local_208);
      }
      uVar7 = uVar7 + 1;
    } while ((uint)local_1d0 != uVar7);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::ostream::operator<<(&local_1a8,(int)local_1d0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)local_1c8,0,(char *)0x0,0x1c5f108);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_1f0 = *plVar3;
    lStack_1e8 = plVar1[3];
    local_200 = &local_1f0;
  }
  else {
    local_1f0 = *plVar3;
    local_200 = (long *)*plVar1;
  }
  local_1f8 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_200);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_218 = *plVar3;
    lStack_210 = plVar1[3];
    local_228 = &local_218;
  }
  else {
    local_218 = *plVar3;
    local_228 = (long *)*plVar1;
  }
  local_220 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_228);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_238 = *plVar3;
    lStack_230 = plVar1[3];
    local_248 = &local_238;
  }
  else {
    local_238 = *plVar3;
    local_248 = (long *)*plVar1;
  }
  local_240 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_208,(ulong)local_248);
  if (local_248 != &local_238) {
    operator_delete(local_248,local_238 + 1);
  }
  if (local_228 != &local_218) {
    operator_delete(local_228,local_218 + 1);
  }
  if (local_200 != &local_1f0) {
    operator_delete(local_200,local_1f0 + 1);
  }
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  return local_208;
}

Assistant:

static string textureLookupFragmentTemplate (int numLookups, ConditionalUsage conditionalUsage, ConditionalType conditionalType)
{
	string resultTemplate;

	resultTemplate +=
		"#version 300 es\n"
		"layout(location = 0) out mediump vec4 o_color;\n"
		"in mediump vec2 v_coords${NAME_SPEC};\n";

	if (conditionalUsage != CONDITIONAL_USAGE_NONE && conditionalType == CONDITIONAL_TYPE_DYNAMIC)
		resultTemplate +=
			"in mediump float v_condition${NAME_SPEC};\n";

	for (int i = 0; i < numLookups; i++)
		resultTemplate +=
			"uniform sampler2D u_sampler" + de::toString(i) + "${NAME_SPEC};\n";

	if (conditionalUsage != CONDITIONAL_USAGE_NONE && conditionalType == CONDITIONAL_TYPE_UNIFORM)
		resultTemplate +=
			"uniform mediump float u_condition${NAME_SPEC};\n";

	resultTemplate +=
		"\n"
		"void main()\n"
		"{\n"
		"	mediump vec4 color = vec4(0.0);\n";

	const char* conditionalTerm = conditionalType == CONDITIONAL_TYPE_STATIC	? "1.0 > 0.0"
								: conditionalType == CONDITIONAL_TYPE_UNIFORM	? "u_condition${NAME_SPEC} > 0.0"
								: conditionalType == CONDITIONAL_TYPE_DYNAMIC	? "v_condition${NAME_SPEC} > 0.0"
								: DE_NULL;

	DE_ASSERT(conditionalTerm != DE_NULL);

	if (conditionalUsage == CONDITIONAL_USAGE_FIRST_HALF)
		resultTemplate += string("") +
			"	if (" + conditionalTerm + ")\n"
			"	{\n";

	for (int i = 0; i < numLookups; i++)
	{
		if (conditionalUsage == CONDITIONAL_USAGE_FIRST_HALF)
		{
			if (i < (numLookups + 1) / 2)
				resultTemplate += "\t";
		}
		else if (conditionalUsage == CONDITIONAL_USAGE_EVERY_OTHER)
		{
			if (i % 2 == 0)
				resultTemplate += string("") +
					"	if (" + conditionalTerm + ")\n"
					"\t";
		}

		resultTemplate +=
			"	color += texture(u_sampler" + de::toString(i) + "${NAME_SPEC}, v_coords${NAME_SPEC});\n";

		if (conditionalUsage == CONDITIONAL_USAGE_FIRST_HALF && i == (numLookups - 1) / 2)
			resultTemplate += "\t}\n";
	}

	resultTemplate +=
		"	o_color = color/" + de::toString(numLookups) + ".0 + ${FLOAT01};\n" +
		"${SEMANTIC_ERROR}"
		"}\n"
		"${INVALID_CHAR}";

	return resultTemplate;
}